

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

int32 __thiscall rw::PluginList::getPluginOffset(PluginList *this,uint32 id)

{
  Plugin *pPVar1;
  Plugin *pPVar2;
  Plugin *pPVar3;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  uint32 id_local;
  PluginList *this_local;
  
  p = (Plugin *)(this->plugins).link.next;
  do {
    pPVar1 = *(Plugin **)p;
    pPVar3 = (Plugin *)LinkList::end(&this->plugins);
    if (p == pPVar3) {
      return -1;
    }
    pPVar3 = p + -1;
    pPVar2 = p + -1;
    p = pPVar1;
  } while (*(uint32 *)&pPVar2->read != id);
  return *(int32 *)&pPVar3->copy;
}

Assistant:

int32
PluginList::getPluginOffset(uint32 id)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id)
			return p->offset;
	}
	return -1;
}